

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O0

void __thiscall
AddressFactory_CheckAddressNetType_elements_Test::TestBody
          (AddressFactory_CheckAddressNetType_elements_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  char *pcVar10;
  char *in_R9;
  AssertionResult gtest_ar__55;
  AssertionResult gtest_ar__54;
  AssertionResult gtest_ar__53;
  AssertionResult gtest_ar__52;
  AssertionResult gtest_ar__51;
  AssertionResult gtest_ar__50;
  AssertionResult gtest_ar__49;
  AssertionResult gtest_ar__48;
  AssertionResult gtest_ar__47;
  AssertionResult gtest_ar__46;
  AssertionResult gtest_ar__45;
  AssertionResult gtest_ar__44;
  AssertionResult gtest_ar__43;
  AssertionResult gtest_ar__42;
  AssertionResult gtest_ar__41;
  AssertionResult gtest_ar__40;
  AssertionResult gtest_ar__39;
  AssertionResult gtest_ar__38;
  AssertionResult gtest_ar__37;
  AssertionResult gtest_ar__36;
  AssertionResult gtest_ar__35;
  AssertionResult gtest_ar__34;
  AssertionResult gtest_ar__33;
  AssertionResult gtest_ar__32;
  AssertionResult gtest_ar__31;
  AssertionResult gtest_ar__30;
  AssertionResult gtest_ar__29;
  AssertionResult gtest_ar__28;
  AssertionResult gtest_ar__27;
  AssertionResult gtest_ar__26;
  AssertionResult gtest_ar__25;
  AssertionResult gtest_ar__24;
  AssertionResult gtest_ar__23;
  AssertionResult gtest_ar__22;
  AssertionResult gtest_ar__21;
  AssertionResult gtest_ar__20;
  AssertionResult gtest_ar__19;
  AssertionResult gtest_ar__18;
  AssertionResult gtest_ar__17;
  AssertionResult gtest_ar__16;
  AssertionResult gtest_ar__15;
  AssertionResult gtest_ar__14;
  Script script;
  AssertionResult gtest_ar__13;
  AssertionResult gtest_ar__12;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  Address addr;
  Pubkey pubkey;
  AddressFactory factory;
  undefined4 in_stack_ffffffffffffe0a8;
  NetType in_stack_ffffffffffffe0ac;
  undefined1 in_stack_ffffffffffffe0b0;
  undefined1 in_stack_ffffffffffffe0b1;
  undefined1 in_stack_ffffffffffffe0b2;
  undefined1 in_stack_ffffffffffffe0b3;
  undefined1 in_stack_ffffffffffffe0b4;
  undefined1 in_stack_ffffffffffffe0b5;
  undefined1 in_stack_ffffffffffffe0b6;
  undefined1 in_stack_ffffffffffffe0b7;
  undefined1 in_stack_ffffffffffffe0b8;
  undefined1 in_stack_ffffffffffffe0b9;
  undefined1 in_stack_ffffffffffffe0ba;
  undefined1 in_stack_ffffffffffffe0bb;
  undefined1 in_stack_ffffffffffffe0bc;
  undefined1 in_stack_ffffffffffffe0bd;
  undefined1 in_stack_ffffffffffffe0be;
  undefined1 in_stack_ffffffffffffe0bf;
  undefined1 in_stack_ffffffffffffe0c0;
  undefined1 in_stack_ffffffffffffe0c1;
  undefined1 in_stack_ffffffffffffe0c2;
  undefined1 in_stack_ffffffffffffe0c3;
  undefined1 in_stack_ffffffffffffe0c4;
  undefined1 in_stack_ffffffffffffe0c5;
  undefined1 in_stack_ffffffffffffe0c6;
  undefined1 in_stack_ffffffffffffe0c7;
  string local_1eb8;
  NetType in_stack_ffffffffffffe16c;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffe170;
  undefined7 in_stack_ffffffffffffe178;
  undefined1 in_stack_ffffffffffffe17f;
  AssertionResult local_1e80;
  string local_1e70;
  AssertHelper local_1e50;
  Message local_1e48;
  byte local_1e39;
  AssertionResult local_1e38;
  string local_1e28;
  AssertHelper local_1e08;
  Message local_1e00;
  undefined1 local_1df1;
  AssertionResult local_1df0;
  string local_1de0;
  AssertHelper local_1dc0;
  Message local_1db8;
  byte local_1da9;
  AssertionResult local_1da8;
  string local_1d98;
  AssertHelper local_1d78;
  Message local_1d70;
  byte local_1d61;
  AssertionResult local_1d60;
  string local_1d50;
  AssertHelper local_1d30;
  Message local_1d28;
  byte local_1d19;
  AssertionResult local_1d18;
  string local_1d08;
  AssertHelper local_1ce8;
  Message local_1ce0;
  byte local_1cd1;
  AssertionResult local_1cd0;
  AssertHelper local_1cc0;
  Message local_1cb8;
  Address local_1cb0;
  string local_1b38;
  AssertHelper local_1b18;
  Message local_1b10;
  byte local_1b01;
  AssertionResult local_1b00;
  string local_1af0;
  AssertHelper local_1ad0;
  Message local_1ac8;
  byte local_1ab9;
  AssertionResult local_1ab8;
  string local_1aa8;
  AssertHelper local_1a88;
  Message local_1a80;
  undefined1 local_1a71;
  AssertionResult local_1a70;
  string local_1a60;
  AssertHelper local_1a40;
  Message local_1a38;
  byte local_1a29;
  AssertionResult local_1a28;
  string local_1a18;
  AssertHelper local_19f8;
  Message local_19f0;
  byte local_19e1;
  AssertionResult local_19e0;
  string local_19d0;
  AssertHelper local_19b0;
  Message local_19a8;
  byte local_1999;
  AssertionResult local_1998;
  string local_1988;
  AssertHelper local_1968;
  Message local_1960;
  byte local_1951;
  AssertionResult local_1950;
  AssertHelper local_1940;
  Message local_1938;
  Address local_1930;
  string local_17b8;
  AssertHelper local_1798;
  Message local_1790;
  byte local_1781;
  AssertionResult local_1780;
  string local_1770;
  AssertHelper local_1750;
  Message local_1748;
  byte local_1739;
  AssertionResult local_1738;
  string local_1728;
  AssertHelper local_1708;
  Message local_1700;
  undefined1 local_16f1;
  AssertionResult local_16f0;
  string local_16e0;
  AssertHelper local_16c0;
  Message local_16b8;
  byte local_16a9;
  AssertionResult local_16a8;
  string local_1698;
  AssertHelper local_1678;
  Message local_1670;
  byte local_1661;
  AssertionResult local_1660;
  string local_1650;
  AssertHelper local_1630;
  Message local_1628;
  byte local_1619;
  AssertionResult local_1618;
  string local_1608;
  AssertHelper local_15e8;
  Message local_15e0;
  byte local_15d1;
  AssertionResult local_15d0;
  AssertHelper local_15c0;
  Message local_15b8;
  Address local_15b0;
  string local_1438;
  AssertHelper local_1418;
  Message local_1410;
  byte local_1401;
  AssertionResult local_1400;
  string local_13f0;
  AssertHelper local_13d0;
  Message local_13c8;
  byte local_13b9;
  AssertionResult local_13b8;
  string local_13a8;
  AssertHelper local_1388;
  Message local_1380;
  undefined1 local_1371;
  AssertionResult local_1370;
  string local_1360;
  AssertHelper local_1340;
  Message local_1338;
  byte local_1329;
  AssertionResult local_1328;
  string local_1318;
  AssertHelper local_12f8;
  Message local_12f0;
  byte local_12e1;
  AssertionResult local_12e0;
  string local_12d0;
  AssertHelper local_12b0;
  Message local_12a8;
  byte local_1299;
  AssertionResult local_1298;
  string local_1288;
  AssertHelper local_1268;
  Message local_1260;
  byte local_1251;
  AssertionResult local_1250;
  AssertHelper local_1240;
  Message local_1238;
  Address local_1230;
  string local_1078;
  AssertHelper local_1058;
  Message local_1050;
  byte local_1041;
  AssertionResult local_1040;
  string local_1030;
  AssertHelper local_1010;
  Message local_1008;
  byte local_ff9;
  AssertionResult local_ff8;
  string local_fe8;
  AssertHelper local_fc8;
  Message local_fc0;
  byte local_fb1;
  AssertionResult local_fb0;
  string local_fa0;
  AssertHelper local_f80;
  Message local_f78;
  undefined1 local_f69;
  AssertionResult local_f68;
  string local_f58;
  AssertHelper local_f38;
  Message local_f30;
  byte local_f21;
  AssertionResult local_f20;
  string local_f10;
  AssertHelper local_ef0;
  Message local_ee8;
  byte local_ed9;
  AssertionResult local_ed8;
  string local_ec8;
  AssertHelper local_ea8;
  Message local_ea0;
  byte local_e91;
  AssertionResult local_e90;
  AssertHelper local_e80;
  Message local_e78;
  Address local_e70;
  string local_cf8;
  AssertHelper local_cd8;
  Message local_cd0;
  byte local_cc1;
  AssertionResult local_cc0;
  string local_cb0;
  AssertHelper local_c90;
  Message local_c88;
  byte local_c79;
  AssertionResult local_c78;
  string local_c68;
  AssertHelper local_c48;
  Message local_c40;
  byte local_c31;
  AssertionResult local_c30;
  string local_c20;
  AssertHelper local_c00;
  Message local_bf8;
  undefined1 local_be9;
  AssertionResult local_be8;
  string local_bd8;
  AssertHelper local_bb8;
  Message local_bb0;
  byte local_ba1;
  AssertionResult local_ba0;
  string local_b90;
  AssertHelper local_b70;
  Message local_b68;
  byte local_b59;
  AssertionResult local_b58;
  string local_b48;
  AssertHelper local_b28;
  Message local_b20;
  byte local_b11;
  AssertionResult local_b10;
  AssertHelper local_b00;
  Message local_af8;
  Address local_af0;
  allocator local_971;
  string local_970;
  Script local_950;
  string local_918;
  AssertHelper local_8f8;
  Message local_8f0;
  byte local_8e1;
  AssertionResult local_8e0;
  string local_8d0;
  AssertHelper local_8b0;
  Message local_8a8;
  byte local_899;
  AssertionResult local_898;
  string local_888;
  AssertHelper local_868;
  Message local_860;
  byte local_851;
  AssertionResult local_850;
  string local_840;
  AssertHelper local_820;
  Message local_818;
  undefined1 local_809;
  AssertionResult local_808;
  string local_7f8;
  AssertHelper local_7d8;
  Message local_7d0;
  byte local_7c1;
  AssertionResult local_7c0;
  string local_7b0;
  AssertHelper local_790;
  Message local_788;
  byte local_779;
  AssertionResult local_778;
  string local_768;
  AssertHelper local_748;
  Message local_740;
  byte local_731;
  AssertionResult local_730;
  AssertHelper local_720;
  Message local_718;
  Address local_710;
  string local_598;
  AssertHelper local_578;
  Message local_570;
  byte local_561;
  AssertionResult local_560;
  string local_550;
  AssertHelper local_530;
  Message local_528;
  byte local_519;
  AssertionResult local_518;
  string local_508;
  AssertHelper local_4e8;
  Message local_4e0;
  byte local_4d1;
  AssertionResult local_4d0;
  string local_4c0;
  AssertHelper local_4a0;
  Message local_498;
  undefined1 local_489;
  AssertionResult local_488;
  string local_478;
  AssertHelper local_458;
  Message local_450;
  byte local_441;
  AssertionResult local_440;
  string local_430;
  AssertHelper local_410;
  Message local_408;
  byte local_3f9;
  AssertionResult local_3f8;
  string local_3e8;
  AssertHelper local_3c8;
  Message local_3c0;
  byte local_3b1;
  AssertionResult local_3b0;
  AssertHelper local_3a0;
  Message local_398 [2];
  Address local_388;
  Address local_210;
  allocator local_91;
  string local_90;
  Pubkey local_70 [4];
  
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             in_stack_ffffffffffffe0ac,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1d781e);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffe0c7,
                      CONCAT16(in_stack_ffffffffffffe0c6,
                               CONCAT15(in_stack_ffffffffffffe0c5,
                                        CONCAT14(in_stack_ffffffffffffe0c4,
                                                 CONCAT13(in_stack_ffffffffffffe0c3,
                                                          CONCAT12(in_stack_ffffffffffffe0c2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0c1,
                                                  in_stack_ffffffffffffe0c0))))))));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_90,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af",&local_91);
  cfd::core::Pubkey::Pubkey(local_70,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  cfd::core::Address::Address(&local_210);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_388);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(local_398);
    testing::internal::AssertHelper::AssertHelper
              (&local_3a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c6,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_3a0,local_398);
    testing::internal::AssertHelper::~AssertHelper(&local_3a0);
    testing::Message::~Message((Message *)0x1d7a8d);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_3b1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d7b23)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3b0);
  if (!bVar1) {
    testing::Message::Message(&local_3c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_3e8,(internal *)&local_3b0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_3c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c7,pcVar10);
    testing::internal::AssertHelper::operator=(&local_3c8,&local_3c0);
    testing::internal::AssertHelper::~AssertHelper(&local_3c8);
    std::__cxx11::string::~string((string *)&local_3e8);
    testing::Message::~Message((Message *)0x1d7c0f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d7c8a);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_3f9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d7cd8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_3f8);
  if (!bVar1) {
    testing::Message::Message(&local_408);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_430,(internal *)&local_3f8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_410,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_410,&local_408);
    testing::internal::AssertHelper::~AssertHelper(&local_410);
    std::__cxx11::string::~string((string *)&local_430);
    testing::Message::~Message((Message *)0x1d7dd6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d7e51);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_441 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d7e9f)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_440);
  if (!bVar1) {
    testing::Message::Message(&local_450);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_478,(internal *)&local_440,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_458,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1c9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_458,&local_450);
    testing::internal::AssertHelper::~AssertHelper(&local_458);
    std::__cxx11::string::~string((string *)&local_478);
    testing::Message::~Message((Message *)0x1d7f9d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8018);
  local_489 = cfd::AddressFactory::CheckAddressNetType
                        ((AddressFactory *)
                         CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                         (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d8064)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_488);
  if (!bVar1) {
    testing::Message::Message(&local_498);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_4c0,(internal *)&local_488,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ca,pcVar10);
    testing::internal::AssertHelper::operator=(&local_4a0,&local_498);
    testing::internal::AssertHelper::~AssertHelper(&local_4a0);
    std::__cxx11::string::~string((string *)&local_4c0);
    testing::Message::~Message((Message *)0x1d8162);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d81dd);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_4d1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d822b)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4d0);
  if (!bVar1) {
    testing::Message::Message(&local_4e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_508,(internal *)&local_4d0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_4e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cb,pcVar10);
    testing::internal::AssertHelper::operator=(&local_4e8,&local_4e0);
    testing::internal::AssertHelper::~AssertHelper(&local_4e8);
    std::__cxx11::string::~string((string *)&local_508);
    testing::Message::~Message((Message *)0x1d8329);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d83a4);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_519 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d83f2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_518);
  if (!bVar1) {
    testing::Message::Message(&local_528);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_550,(internal *)&local_518,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_530,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cc,pcVar10);
    testing::internal::AssertHelper::operator=(&local_530,&local_528);
    testing::internal::AssertHelper::~AssertHelper(&local_530);
    std::__cxx11::string::~string((string *)&local_550);
    testing::Message::~Message((Message *)0x1d84f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d856b);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_561 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d85b9)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_560);
  if (!bVar1) {
    testing::Message::Message(&local_570);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_598,(internal *)&local_560,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_578,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cd,pcVar10);
    testing::internal::AssertHelper::operator=(&local_578,&local_570);
    testing::internal::AssertHelper::~AssertHelper(&local_578);
    std::__cxx11::string::~string((string *)&local_598);
    testing::Message::~Message((Message *)0x1d86b7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8732);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_710);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_718);
    testing::internal::AssertHelper::AssertHelper
              (&local_720,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1cf,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_720,&local_718);
    testing::internal::AssertHelper::~AssertHelper(&local_720);
    testing::Message::~Message((Message *)0x1d8881);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_731 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d8911)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_730);
  if (!bVar1) {
    testing::Message::Message(&local_740);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_768,(internal *)&local_730,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_748,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_748,&local_740);
    testing::internal::AssertHelper::~AssertHelper(&local_748);
    std::__cxx11::string::~string((string *)&local_768);
    testing::Message::~Message((Message *)0x1d89f7);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8a6f);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_779 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d8ab7)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_778);
  if (!bVar1) {
    testing::Message::Message(&local_788);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7b0,(internal *)&local_778,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_790,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_790,&local_788);
    testing::internal::AssertHelper::~AssertHelper(&local_790);
    std::__cxx11::string::~string((string *)&local_7b0);
    testing::Message::~Message((Message *)0x1d8baf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8c27);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_7c1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d8c6f)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_7c0);
  if (!bVar1) {
    testing::Message::Message(&local_7d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_7f8,(internal *)&local_7c0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_7d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_7d8,&local_7d0);
    testing::internal::AssertHelper::~AssertHelper(&local_7d8);
    std::__cxx11::string::~string((string *)&local_7f8);
    testing::Message::~Message((Message *)0x1d8d67);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8ddf);
  local_809 = cfd::AddressFactory::CheckAddressNetType
                        ((AddressFactory *)
                         CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                         (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d8e25)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_808);
  if (!bVar1) {
    testing::Message::Message(&local_818);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_840,(internal *)&local_808,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_820,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_820,&local_818);
    testing::internal::AssertHelper::~AssertHelper(&local_820);
    std::__cxx11::string::~string((string *)&local_840);
    testing::Message::~Message((Message *)0x1d8f1d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d8f95);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_851 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d8fdd)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_850);
  if (!bVar1) {
    testing::Message::Message(&local_860);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_888,(internal *)&local_850,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_868,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_868,&local_860);
    testing::internal::AssertHelper::~AssertHelper(&local_868);
    std::__cxx11::string::~string((string *)&local_888);
    testing::Message::~Message((Message *)0x1d90d5);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d914d);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_899 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9195)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_898);
  if (!bVar1) {
    testing::Message::Message(&local_8a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_8d0,(internal *)&local_898,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d5,pcVar10);
    testing::internal::AssertHelper::operator=(&local_8b0,&local_8a8);
    testing::internal::AssertHelper::~AssertHelper(&local_8b0);
    std::__cxx11::string::~string((string *)&local_8d0);
    testing::Message::~Message((Message *)0x1d928d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9305);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_8e1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d934d)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_8e0);
  if (!bVar1) {
    testing::Message::Message(&local_8f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_918,(internal *)&local_8e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_8f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_8f8,&local_8f0);
    testing::internal::AssertHelper::~AssertHelper(&local_8f8);
    std::__cxx11::string::~string((string *)&local_918);
    testing::Message::~Message((Message *)0x1d9445);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d94c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_970,"76a914ef286e6af39de178d88b32e120f716b53753808c88ac",&local_971);
  cfd::core::Script::Script(&local_950,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator((allocator<char> *)&local_971);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_af0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_af8);
    testing::internal::AssertHelper::AssertHelper
              (&local_b00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1d9,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_b00,&local_af8);
    testing::internal::AssertHelper::~AssertHelper(&local_b00);
    testing::Message::~Message((Message *)0x1d96d2);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_b11 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9762)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b10);
  if (!bVar1) {
    testing::Message::Message(&local_b20);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b48,(internal *)&local_b10,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b28,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1da,pcVar10);
    testing::internal::AssertHelper::operator=(&local_b28,&local_b20);
    testing::internal::AssertHelper::~AssertHelper(&local_b28);
    std::__cxx11::string::~string((string *)&local_b48);
    testing::Message::~Message((Message *)0x1d9848);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d98c0);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_b59 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9908)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_b58);
  if (!bVar1) {
    testing::Message::Message(&local_b68);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b90,(internal *)&local_b58,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1db,pcVar10);
    testing::internal::AssertHelper::operator=(&local_b70,&local_b68);
    testing::internal::AssertHelper::~AssertHelper(&local_b70);
    std::__cxx11::string::~string((string *)&local_b90);
    testing::Message::~Message((Message *)0x1d9a00);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9a78);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_ba1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9ac0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ba0);
  if (!bVar1) {
    testing::Message::Message(&local_bb0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_bd8,(internal *)&local_ba0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_bb8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1dc,pcVar10);
    testing::internal::AssertHelper::operator=(&local_bb8,&local_bb0);
    testing::internal::AssertHelper::~AssertHelper(&local_bb8);
    std::__cxx11::string::~string((string *)&local_bd8);
    testing::Message::~Message((Message *)0x1d9bb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9c30);
  local_be9 = cfd::AddressFactory::CheckAddressNetType
                        ((AddressFactory *)
                         CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                         (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9c76)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_be8);
  if (!bVar1) {
    testing::Message::Message(&local_bf8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c20,(internal *)&local_be8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c00,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1dd,pcVar10);
    testing::internal::AssertHelper::operator=(&local_c00,&local_bf8);
    testing::internal::AssertHelper::~AssertHelper(&local_c00);
    std::__cxx11::string::~string((string *)&local_c20);
    testing::Message::~Message((Message *)0x1d9d6e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9de6);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_c31 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9e2e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c30);
  if (!bVar1) {
    testing::Message::Message(&local_c40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_c68,(internal *)&local_c30,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1de,pcVar10);
    testing::internal::AssertHelper::operator=(&local_c48,&local_c40);
    testing::internal::AssertHelper::~AssertHelper(&local_c48);
    std::__cxx11::string::~string((string *)&local_c68);
    testing::Message::~Message((Message *)0x1d9f26);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d9f9e);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_c79 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1d9fe6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c78);
  if (!bVar1) {
    testing::Message::Message(&local_c88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cb0,(internal *)&local_c78,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c90,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1df,pcVar10);
    testing::internal::AssertHelper::operator=(&local_c90,&local_c88);
    testing::internal::AssertHelper::~AssertHelper(&local_c90);
    std::__cxx11::string::~string((string *)&local_cb0);
    testing::Message::~Message((Message *)0x1da0de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da156);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_cc1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1da19e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cc0);
  if (!bVar1) {
    testing::Message::Message(&local_cd0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_cf8,(internal *)&local_cc0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_cd8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_cd8,&local_cd0);
    testing::internal::AssertHelper::~AssertHelper(&local_cd8);
    std::__cxx11::string::~string((string *)&local_cf8);
    testing::Message::~Message((Message *)0x1da296);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da311);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_e70);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_e78);
    testing::internal::AssertHelper::AssertHelper
              (&local_e80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e2,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_e80,&local_e78);
    testing::internal::AssertHelper::~AssertHelper(&local_e80);
    testing::Message::~Message((Message *)0x1da460);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_e91 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1da4f0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e90);
  if (!bVar1) {
    testing::Message::Message(&local_ea0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_ec8,(internal *)&local_e90,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ea8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e3,pcVar10);
    testing::internal::AssertHelper::operator=(&local_ea8,&local_ea0);
    testing::internal::AssertHelper::~AssertHelper(&local_ea8);
    std::__cxx11::string::~string((string *)&local_ec8);
    testing::Message::~Message((Message *)0x1da5d6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da64e);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_ed9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1da696)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ed8);
  if (!bVar1) {
    testing::Message::Message(&local_ee8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f10,(internal *)&local_ed8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_ef0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e4,pcVar10);
    testing::internal::AssertHelper::operator=(&local_ef0,&local_ee8);
    testing::internal::AssertHelper::~AssertHelper(&local_ef0);
    std::__cxx11::string::~string((string *)&local_f10);
    testing::Message::~Message((Message *)0x1da78e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da806);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_f21 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1da84e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f20);
  if (!bVar1) {
    testing::Message::Message(&local_f30);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_f58,(internal *)&local_f20,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f38,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e5,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f38,&local_f30);
    testing::internal::AssertHelper::~AssertHelper(&local_f38);
    std::__cxx11::string::~string((string *)&local_f58);
    testing::Message::~Message((Message *)0x1da946);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1da9be);
  local_f69 = cfd::AddressFactory::CheckAddressNetType
                        ((AddressFactory *)
                         CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                         (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1daa04)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f68);
  if (!bVar1) {
    testing::Message::Message(&local_f78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fa0,(internal *)&local_f68,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","false",
               "true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_f80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_f80,&local_f78);
    testing::internal::AssertHelper::~AssertHelper(&local_f80);
    std::__cxx11::string::~string((string *)&local_fa0);
    testing::Message::~Message((Message *)0x1daafc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dab74);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_fb1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dabbc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_fb0);
  if (!bVar1) {
    testing::Message::Message(&local_fc0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_fe8,(internal *)&local_fb0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "true","false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_fc8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e7,pcVar10);
    testing::internal::AssertHelper::operator=(&local_fc8,&local_fc0);
    testing::internal::AssertHelper::~AssertHelper(&local_fc8);
    std::__cxx11::string::~string((string *)&local_fe8);
    testing::Message::~Message((Message *)0x1dacb4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dad2c);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_ff9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dad74)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_ff8);
  if (!bVar1) {
    testing::Message::Message(&local_1008);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1030,(internal *)&local_ff8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1010,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1010,&local_1008);
    testing::internal::AssertHelper::~AssertHelper(&local_1010);
    std::__cxx11::string::~string((string *)&local_1030);
    testing::Message::~Message((Message *)0x1dae6c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1daee4);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1041 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1daf2c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1040);
  if (!bVar1) {
    testing::Message::Message(&local_1050);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1078,(internal *)&local_1040,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1058,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1e9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1058,&local_1050);
    testing::internal::AssertHelper::~AssertHelper(&local_1058);
    std::__cxx11::string::~string((string *)&local_1078);
    testing::Message::~Message((Message *)0x1db024);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db09f);
  cfd::core::GetElementsAddressFormatList();
  cfd::AddressFactory::AddressFactory
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             in_stack_ffffffffffffe0ac,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x1db0c8);
  cfd::AddressFactory::operator=
            ((AddressFactory *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (AddressFactory *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8));
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1db0ee);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             CONCAT17(in_stack_ffffffffffffe0c7,
                      CONCAT16(in_stack_ffffffffffffe0c6,
                               CONCAT15(in_stack_ffffffffffffe0c5,
                                        CONCAT14(in_stack_ffffffffffffe0c4,
                                                 CONCAT13(in_stack_ffffffffffffe0c3,
                                                          CONCAT12(in_stack_ffffffffffffe0c2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0c1,
                                                  in_stack_ffffffffffffe0c0))))))));
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2pkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_1230);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_1238);
    testing::internal::AssertHelper::AssertHelper
              (&local_1240,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ec,
               "Expected: addr = factory.CreateP2pkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1240,&local_1238);
    testing::internal::AssertHelper::~AssertHelper(&local_1240);
    testing::Message::~Message((Message *)0x1db296);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1251 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1db326)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1250);
  if (!bVar1) {
    testing::Message::Message(&local_1260);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1288,(internal *)&local_1250,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1268,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ed,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1268,&local_1260);
    testing::internal::AssertHelper::~AssertHelper(&local_1268);
    std::__cxx11::string::~string((string *)&local_1288);
    testing::Message::~Message((Message *)0x1db40c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db484);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1299 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1db4cc)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1298);
  if (!bVar1) {
    testing::Message::Message(&local_12a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_12d0,(internal *)&local_1298,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ee,pcVar10);
    testing::internal::AssertHelper::operator=(&local_12b0,&local_12a8);
    testing::internal::AssertHelper::~AssertHelper(&local_12b0);
    std::__cxx11::string::~string((string *)&local_12d0);
    testing::Message::~Message((Message *)0x1db5c4);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db63c);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_12e1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1db684)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_12e0);
  if (!bVar1) {
    testing::Message::Message(&local_12f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1318,(internal *)&local_12e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_12f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ef,pcVar10);
    testing::internal::AssertHelper::operator=(&local_12f8,&local_12f0);
    testing::internal::AssertHelper::~AssertHelper(&local_12f8);
    std::__cxx11::string::~string((string *)&local_1318);
    testing::Message::~Message((Message *)0x1db77c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db7f4);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1329 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1db83c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1328);
  if (!bVar1) {
    testing::Message::Message(&local_1338);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1360,(internal *)&local_1328,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1340,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f0,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1340,&local_1338);
    testing::internal::AssertHelper::~AssertHelper(&local_1340);
    std::__cxx11::string::~string((string *)&local_1360);
    testing::Message::~Message((Message *)0x1db934);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1db9ac);
  local_1371 = cfd::AddressFactory::CheckAddressNetType
                         ((AddressFactory *)
                          CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                          (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1db9f2)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1370);
  if (!bVar1) {
    testing::Message::Message(&local_1380);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13a8,(internal *)&local_1370,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1388,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f1,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1388,&local_1380);
    testing::internal::AssertHelper::~AssertHelper(&local_1388);
    std::__cxx11::string::~string((string *)&local_13a8);
    testing::Message::~Message((Message *)0x1dbaea);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbb62);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_13b9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dbbaa)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_13b8);
  if (!bVar1) {
    testing::Message::Message(&local_13c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_13f0,(internal *)&local_13b8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_13d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f2,pcVar10);
    testing::internal::AssertHelper::operator=(&local_13d0,&local_13c8);
    testing::internal::AssertHelper::~AssertHelper(&local_13d0);
    std::__cxx11::string::~string((string *)&local_13f0);
    testing::Message::~Message((Message *)0x1dbca2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbd1a);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1401 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dbd62)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1400);
  if (!bVar1) {
    testing::Message::Message(&local_1410);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1438,(internal *)&local_1400,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,499,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1418,&local_1410);
    testing::internal::AssertHelper::~AssertHelper(&local_1418);
    std::__cxx11::string::~string((string *)&local_1438);
    testing::Message::~Message((Message *)0x1dbe5a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dbed5);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wpkhAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Pubkey *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_15b0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_15b8);
    testing::internal::AssertHelper::AssertHelper
              (&local_15c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f5,
               "Expected: addr = factory.CreateP2wpkhAddress(pubkey) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_15c0,&local_15b8);
    testing::internal::AssertHelper::~AssertHelper(&local_15c0);
    testing::Message::~Message((Message *)0x1dc024);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_15d1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dc0b4)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_15d0);
  if (!bVar1) {
    testing::Message::Message(&local_15e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1608,(internal *)&local_15d0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_15e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f6,pcVar10);
    testing::internal::AssertHelper::operator=(&local_15e8,&local_15e0);
    testing::internal::AssertHelper::~AssertHelper(&local_15e8);
    std::__cxx11::string::~string((string *)&local_1608);
    testing::Message::~Message((Message *)0x1dc19a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc212);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1619 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dc25a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1618);
  if (!bVar1) {
    testing::Message::Message(&local_1628);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1650,(internal *)&local_1618,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1630,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f7,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1630,&local_1628);
    testing::internal::AssertHelper::~AssertHelper(&local_1630);
    std::__cxx11::string::~string((string *)&local_1650);
    testing::Message::~Message((Message *)0x1dc352);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc3ca);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1661 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dc412)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1660);
  if (!bVar1) {
    testing::Message::Message(&local_1670);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1698,(internal *)&local_1660,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1678,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f8,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1678,&local_1670);
    testing::internal::AssertHelper::~AssertHelper(&local_1678);
    std::__cxx11::string::~string((string *)&local_1698);
    testing::Message::~Message((Message *)0x1dc50a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc582);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_16a9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dc5ca)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16a8);
  if (!bVar1) {
    testing::Message::Message(&local_16b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_16e0,(internal *)&local_16a8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_16c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1f9,pcVar10);
    testing::internal::AssertHelper::operator=(&local_16c0,&local_16b8);
    testing::internal::AssertHelper::~AssertHelper(&local_16c0);
    std::__cxx11::string::~string((string *)&local_16e0);
    testing::Message::~Message((Message *)0x1dc6c2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc73a);
  local_16f1 = cfd::AddressFactory::CheckAddressNetType
                         ((AddressFactory *)
                          CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                          (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dc780)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_16f0);
  if (!bVar1) {
    testing::Message::Message(&local_1700);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1728,(internal *)&local_16f0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1708,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fa,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1708,&local_1700);
    testing::internal::AssertHelper::~AssertHelper(&local_1708);
    std::__cxx11::string::~string((string *)&local_1728);
    testing::Message::~Message((Message *)0x1dc878);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dc8f0);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1739 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dc938)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1738);
  if (!bVar1) {
    testing::Message::Message(&local_1748);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1770,(internal *)&local_1738,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1750,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fb,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1750,&local_1748);
    testing::internal::AssertHelper::~AssertHelper(&local_1750);
    std::__cxx11::string::~string((string *)&local_1770);
    testing::Message::~Message((Message *)0x1dca30);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcaa8);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1781 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dcaf0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1780);
  if (!bVar1) {
    testing::Message::Message(&local_1790);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_17b8,(internal *)&local_1780,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1798,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fc,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1798,&local_1790);
    testing::internal::AssertHelper::~AssertHelper(&local_1798);
    std::__cxx11::string::~string((string *)&local_17b8);
    testing::Message::~Message((Message *)0x1dcbe8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcc63);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2shAddress
                ((AddressFactory *)
                 CONCAT17(in_stack_ffffffffffffe0bf,
                          CONCAT16(in_stack_ffffffffffffe0be,
                                   CONCAT15(in_stack_ffffffffffffe0bd,
                                            CONCAT14(in_stack_ffffffffffffe0bc,
                                                     CONCAT13(in_stack_ffffffffffffe0bb,
                                                              CONCAT12(in_stack_ffffffffffffe0ba,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b9,
                                                  in_stack_ffffffffffffe0b8))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_1930);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_1938);
    testing::internal::AssertHelper::AssertHelper
              (&local_1940,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1fe,
               "Expected: addr = factory.CreateP2shAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1940,&local_1938);
    testing::internal::AssertHelper::~AssertHelper(&local_1940);
    testing::Message::~Message((Message *)0x1dcdb2);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1951 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dce42)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1950);
  if (!bVar1) {
    testing::Message::Message(&local_1960);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1988,(internal *)&local_1950,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1968,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x1ff,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1968,&local_1960);
    testing::internal::AssertHelper::~AssertHelper(&local_1968);
    std::__cxx11::string::~string((string *)&local_1988);
    testing::Message::~Message((Message *)0x1dcf28);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dcfa0);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1999 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dcfe8)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1998);
  if (!bVar1) {
    testing::Message::Message(&local_19a8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_19d0,(internal *)&local_1998,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x200,pcVar10);
    testing::internal::AssertHelper::operator=(&local_19b0,&local_19a8);
    testing::internal::AssertHelper::~AssertHelper(&local_19b0);
    std::__cxx11::string::~string((string *)&local_19d0);
    testing::Message::~Message((Message *)0x1dd0e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd158);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_19e1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dd1a0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_19e0);
  if (!bVar1) {
    testing::Message::Message(&local_19f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a18,(internal *)&local_19e0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_19f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x201,pcVar10);
    testing::internal::AssertHelper::operator=(&local_19f8,&local_19f0);
    testing::internal::AssertHelper::~AssertHelper(&local_19f8);
    std::__cxx11::string::~string((string *)&local_1a18);
    testing::Message::~Message((Message *)0x1dd298);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd310);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1a29 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dd358)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a28);
  if (!bVar1) {
    testing::Message::Message(&local_1a38);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a60,(internal *)&local_1a28,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x202,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1a40,&local_1a38);
    testing::internal::AssertHelper::~AssertHelper(&local_1a40);
    std::__cxx11::string::~string((string *)&local_1a60);
    testing::Message::~Message((Message *)0x1dd450);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd4c8);
  local_1a71 = cfd::AddressFactory::CheckAddressNetType
                         ((AddressFactory *)
                          CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178),
                          (Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dd50e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a70);
  if (!bVar1) {
    testing::Message::Message(&local_1a80);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1aa8,(internal *)&local_1a70,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1a88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x203,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1a88,&local_1a80);
    testing::internal::AssertHelper::~AssertHelper(&local_1a88);
    std::__cxx11::string::~string((string *)&local_1aa8);
    testing::Message::~Message((Message *)0x1dd606);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd67e);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1ab9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dd6c6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1ab8);
  if (!bVar1) {
    testing::Message::Message(&local_1ac8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1af0,(internal *)&local_1ab8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ad0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x204,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1ad0,&local_1ac8);
    testing::internal::AssertHelper::~AssertHelper(&local_1ad0);
    std::__cxx11::string::~string((string *)&local_1af0);
    testing::Message::~Message((Message *)0x1dd7be);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd836);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1b01 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1dd87e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1b00);
  if (!bVar1) {
    testing::Message::Message(&local_1b10);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1b38,(internal *)&local_1b00,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1b18,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x205,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1b18,&local_1b10);
    testing::internal::AssertHelper::~AssertHelper(&local_1b18);
    std::__cxx11::string::~string((string *)&local_1b38);
    testing::Message::~Message((Message *)0x1dd976);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1dd9f1);
  uVar2 = testing::internal::AlwaysTrue();
  if ((bool)uVar2) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::AddressFactory::CreateP2wshAddress
                ((AddressFactory *)
                 CONCAT17(uVar2,CONCAT16(bVar1,CONCAT15(in_stack_ffffffffffffe0bd,
                                                        CONCAT14(in_stack_ffffffffffffe0bc,
                                                                 CONCAT13(in_stack_ffffffffffffe0bb,
                                                                          CONCAT12(
                                                  in_stack_ffffffffffffe0ba,
                                                  CONCAT11(in_stack_ffffffffffffe0b9,
                                                           in_stack_ffffffffffffe0b8))))))),
                 (Script *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
      cfd::core::Address::operator=(&local_210,&local_1cb0);
      cfd::core::Address::~Address
                ((Address *)
                 CONCAT17(in_stack_ffffffffffffe0b7,
                          CONCAT16(in_stack_ffffffffffffe0b6,
                                   CONCAT15(in_stack_ffffffffffffe0b5,
                                            CONCAT14(in_stack_ffffffffffffe0b4,
                                                     CONCAT13(in_stack_ffffffffffffe0b3,
                                                              CONCAT12(in_stack_ffffffffffffe0b2,
                                                                       CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))));
    }
  }
  else {
    testing::Message::Message(&local_1cb8);
    testing::internal::AssertHelper::AssertHelper
              (&local_1cc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x207,
               "Expected: addr = factory.CreateP2wshAddress(script) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_1cc0,&local_1cb8);
    testing::internal::AssertHelper::~AssertHelper(&local_1cc0);
    testing::Message::~Message((Message *)0x1ddb40);
  }
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1cd1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1ddbd0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1cd0);
  if (!bVar1) {
    testing::Message::Message(&local_1ce0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d08,(internal *)&local_1cd0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kMainnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1ce8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x208,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1ce8,&local_1ce0);
    testing::internal::AssertHelper::~AssertHelper(&local_1ce8);
    std::__cxx11::string::~string((string *)&local_1d08);
    testing::Message::~Message((Message *)0x1ddcb6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ddd2e);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1d19 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1ddd76)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d18);
  if (!bVar1) {
    testing::Message::Message(&local_1d28);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d50,(internal *)&local_1d18,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kTestnet)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d30,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x209,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1d30,&local_1d28);
    testing::internal::AssertHelper::~AssertHelper(&local_1d30);
    std::__cxx11::string::~string((string *)&local_1d50);
    testing::Message::~Message((Message *)0x1dde6e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1ddee6);
  bVar1 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1d61 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(in_stack_ffffffffffffe0b7,
                      CONCAT16(in_stack_ffffffffffffe0b6,
                               CONCAT15(in_stack_ffffffffffffe0b5,
                                        CONCAT14(in_stack_ffffffffffffe0b4,
                                                 CONCAT13(in_stack_ffffffffffffe0b3,
                                                          CONCAT12(in_stack_ffffffffffffe0b2,
                                                                   CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1ddf2e)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1d60);
  if (!bVar1) {
    testing::Message::Message(&local_1d70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1d98,(internal *)&local_1d60,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kRegtest)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1d78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20a,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1d78,&local_1d70);
    testing::internal::AssertHelper::~AssertHelper(&local_1d78);
    std::__cxx11::string::~string((string *)&local_1d98);
    testing::Message::~Message((Message *)0x1de026);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de09e);
  uVar2 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1da9 = ~uVar2 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffe0b6,
                                     CONCAT15(in_stack_ffffffffffffe0b5,
                                              CONCAT14(in_stack_ffffffffffffe0b4,
                                                       CONCAT13(in_stack_ffffffffffffe0b3,
                                                                CONCAT12(in_stack_ffffffffffffe0b2,
                                                                         CONCAT11(
                                                  in_stack_ffffffffffffe0b1,
                                                  in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1de0e6)
  ;
  uVar3 = testing::AssertionResult::operator_cast_to_bool(&local_1da8);
  if (!(bool)uVar3) {
    testing::Message::Message(&local_1db8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1de0,(internal *)&local_1da8,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kLiquidV1)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1dc0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20b,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1dc0,&local_1db8);
    testing::internal::AssertHelper::~AssertHelper(&local_1dc0);
    std::__cxx11::string::~string((string *)&local_1de0);
    testing::Message::~Message((Message *)0x1de1de);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de256);
  uVar4 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1df1 = uVar4;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(in_stack_ffffffffffffe0b4,
                                                                   CONCAT13(
                                                  in_stack_ffffffffffffe0b3,
                                                  CONCAT12(in_stack_ffffffffffffe0b2,
                                                           CONCAT11(in_stack_ffffffffffffe0b1,
                                                                    in_stack_ffffffffffffe0b0)))))))
             ,(bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1de29c
            );
  uVar5 = testing::AssertionResult::operator_cast_to_bool(&local_1df0);
  if (!(bool)uVar5) {
    testing::Message::Message(&local_1e00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e28,(internal *)&local_1df0,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kElementsRegtest)",
               "false","true",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e08,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20c,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1e08,&local_1e00);
    testing::internal::AssertHelper::~AssertHelper(&local_1e08);
    std::__cxx11::string::~string((string *)&local_1e28);
    testing::Message::~Message((Message *)0x1de394);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de40c);
  uVar6 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  local_1e39 = ~uVar6 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  in_stack_ffffffffffffe0b2,
                                                  CONCAT11(in_stack_ffffffffffffe0b1,
                                                           in_stack_ffffffffffffe0b0))))))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1de454)
  ;
  uVar7 = testing::AssertionResult::operator_cast_to_bool(&local_1e38);
  if (!(bool)uVar7) {
    testing::Message::Message(&local_1e48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1e70,(internal *)&local_1e38,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kCustomChain)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1e50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20d,pcVar10);
    testing::internal::AssertHelper::operator=(&local_1e50,&local_1e48);
    testing::internal::AssertHelper::~AssertHelper(&local_1e50);
    std::__cxx11::string::~string((string *)&local_1e70);
    testing::Message::~Message((Message *)0x1de54c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de5c4);
  uVar8 = cfd::AddressFactory::CheckAddressNetType
                    ((AddressFactory *)CONCAT17(in_stack_ffffffffffffe17f,in_stack_ffffffffffffe178)
                     ,(Address *)in_stack_ffffffffffffe170.ptr_,in_stack_ffffffffffffe16c);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,in_stack_ffffffffffffe0b0))))
                                                  ))),
             (bool *)CONCAT44(in_stack_ffffffffffffe0ac,in_stack_ffffffffffffe0a8),(type *)0x1de60c)
  ;
  uVar9 = testing::AssertionResult::operator_cast_to_bool(&local_1e80);
  if (!(bool)uVar9) {
    testing::Message::Message((Message *)&stack0xffffffffffffe170);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1eb8,(internal *)&local_1e80,
               (AssertionResult *)"factory.CheckAddressNetType(addr, NetType::kNetTypeNum)","true",
               "false",in_R9);
    pcVar10 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffe168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_address.cpp"
               ,0x20e,pcVar10);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffe168,(Message *)&stack0xffffffffffffe170);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffe168);
    std::__cxx11::string::~string((string *)&local_1eb8);
    testing::Message::~Message((Message *)0x1de704);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1de77c);
  cfd::core::Script::~Script
            ((Script *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  cfd::core::Address::~Address
            ((Address *)
             CONCAT17(uVar2,CONCAT16(uVar3,CONCAT15(uVar4,CONCAT14(uVar5,CONCAT13(uVar6,CONCAT12(
                                                  uVar7,CONCAT11(uVar8,uVar9))))))));
  cfd::core::Pubkey::~Pubkey((Pubkey *)0x1de7a3);
  cfd::AddressFactory::~AddressFactory((AddressFactory *)0x1de7b0);
  return;
}

Assistant:

TEST(AddressFactory, CheckAddressNetType_elements)
{
  AddressFactory factory(NetType::kLiquidV1, GetElementsAddressFormatList());
  Pubkey pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");
  Address addr;
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  Script script = Script("76a914ef286e6af39de178d88b32e120f716b53753808c88ac");
  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  factory = AddressFactory(NetType::kElementsRegtest, GetElementsAddressFormatList());
  EXPECT_NO_THROW(addr = factory.CreateP2pkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wpkhAddress(pubkey));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2shAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));

  EXPECT_NO_THROW(addr = factory.CreateP2wshAddress(script));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kMainnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kTestnet));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kLiquidV1));
  EXPECT_TRUE(factory.CheckAddressNetType(addr, NetType::kElementsRegtest));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kCustomChain));
  EXPECT_FALSE(factory.CheckAddressNetType(addr, NetType::kNetTypeNum));
}